

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O0

nvpair_t * nvlist_find(nvlist_t *nvl,int type,char *name)

{
  int iVar1;
  char *pcVar2;
  int *piVar3;
  nvpair_t *local_28;
  nvpair_t *nvp;
  char *name_local;
  int type_local;
  nvlist_t *nvl_local;
  
  if (nvl == (nvlist_t *)0x0) {
    __assert_fail("(nvl) != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x143,"nvpair_t *nvlist_find(const nvlist_t *, int, const char *)");
  }
  if (nvl->nvl_magic != 0x6e766c) {
    __assert_fail("(nvl)->nvl_magic == 0x6e766c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x143,"nvpair_t *nvlist_find(const nvlist_t *, int, const char *)");
  }
  if (nvl->nvl_error != 0) {
    __assert_fail("nvl->nvl_error == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x144,"nvpair_t *nvlist_find(const nvlist_t *, int, const char *)");
  }
  if ((type != 0) && ((type < 1 || (0xc < type)))) {
    __assert_fail("type == 0 || (type >= 1 && type <= 12)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvlist.c"
                  ,0x146,"nvpair_t *nvlist_find(const nvlist_t *, int, const char *)");
  }
  for (local_28 = nvlist_first_nvpair(nvl); local_28 != (nvpair_t *)0x0;
      local_28 = nvlist_next_nvpair(nvl,local_28)) {
    if ((type == 0) || (iVar1 = nvpair_type(local_28), iVar1 == type)) {
      if ((nvl->nvl_flags & 1U) == 0) {
        pcVar2 = nvpair_name(local_28);
        iVar1 = strcmp(pcVar2,name);
      }
      else {
        pcVar2 = nvpair_name(local_28);
        iVar1 = strcasecmp(pcVar2,name);
      }
      if (iVar1 == 0) break;
    }
  }
  if (local_28 == (nvpair_t *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 2;
  }
  return local_28;
}

Assistant:

static nvpair_t *
nvlist_find(const nvlist_t *nvl, int type, const char *name)
{
	nvpair_t *nvp;

	NVLIST_ASSERT(nvl);
	PJDLOG_ASSERT(nvl->nvl_error == 0);
	PJDLOG_ASSERT(type == NV_TYPE_NONE ||
	    (type >= NV_TYPE_FIRST && type <= NV_TYPE_LAST));

	for (nvp = nvlist_first_nvpair(nvl); nvp != NULL;
	    nvp = nvlist_next_nvpair(nvl, nvp)) {
		if (type != NV_TYPE_NONE && nvpair_type(nvp) != type)
			continue;
		if ((nvl->nvl_flags & NV_FLAG_IGNORE_CASE) != 0) {
			if (strcasecmp(nvpair_name(nvp), name) != 0)
				continue;
		} else {
			if (strcmp(nvpair_name(nvp), name) != 0)
				continue;
		}
		break;
	}

	if (nvp == NULL)
		ERRNO_SET(ENOENT);

	return (nvp);
}